

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::BuildCommentsString_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,SourceLocation *location,
          bool prefer_single_line)

{
  pointer pbVar1;
  ulong uVar2;
  allocator local_149;
  string *local_148;
  allocator local_139;
  char *local_138;
  long local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string prefix;
  string suffix;
  string local_d0;
  string local_b0;
  string epilogue;
  string local_70;
  string line;
  
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148 = __return_storage_ptr__;
  SplitStringAllowEmpty
            ((string *)(this + (ulong)(*(long *)(this + 0x18) == 0) * 0x20 + 0x10),"\n",&lines);
  do {
    if (lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00260094:
      std::__cxx11::string::string((string *)local_148,"",(allocator *)&prefix);
LAB_002603ae:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&lines);
      return local_148;
    }
    if (lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length != 0) {
      if (lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
        prefix._M_string_length = 0;
        prefix.field_2._M_local_buf[0] = '\0';
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        suffix._M_string_length = 0;
        (local_148->_M_dataplus)._M_p = (pointer)&local_148->field_2;
        local_148->_M_string_length = 0;
        suffix.field_2._M_local_buf[0] = '\0';
        (local_148->field_2)._M_local_buf[0] = '\0';
        epilogue._M_dataplus._M_p = (pointer)&epilogue.field_2;
        epilogue._M_string_length = 0;
        epilogue.field_2._M_local_buf[0] = '\0';
        if ((char)location == '\x01' &&
            (long)lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)lines.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) {
          std::__cxx11::string::assign((char *)&prefix);
          std::__cxx11::string::assign((char *)&suffix);
          local_138 = "";
        }
        else {
          std::__cxx11::string::assign((char *)&prefix);
          std::__cxx11::string::assign((char *)&suffix);
          std::__cxx11::string::append((char *)local_148);
          std::__cxx11::string::assign((char *)&epilogue);
          local_138 = " ";
        }
        local_130 = 0;
        for (uVar2 = 0;
            pbVar1 = lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar2 < (ulong)((long)lines.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)lines.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1
            ) {
          std::__cxx11::string::string((string *)&local_70," ",(allocator *)&local_b0);
          StripPrefixString(&line,(string *)((long)&(pbVar1->_M_dataplus)._M_p + local_130),
                            &local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::string((string *)&local_b0,"\\",&local_139);
          std::__cxx11::string::string((string *)&local_d0,"\\\\",&local_149);
          StringReplace(&local_70,&line,&local_b0,&local_d0,true);
          std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::string((string *)&local_b0,"@",&local_139);
          std::__cxx11::string::string((string *)&local_d0,"\\@",&local_149);
          StringReplace(&local_70,&line,&local_b0,&local_d0,true);
          std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::string((string *)&local_b0,"/*",&local_139);
          std::__cxx11::string::string((string *)&local_d0,"/\\*",&local_149);
          StringReplace(&local_70,&line,&local_b0,&local_d0,true);
          std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::string((string *)&local_b0,"*/",&local_139);
          std::__cxx11::string::string((string *)&local_d0,"*\\/",&local_149);
          StringReplace(&local_70,&line,&local_b0,&local_d0,true);
          std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::operator+(&local_70,&prefix,&line);
          std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          StripWhitespace(&line);
          std::operator+(&local_70,local_138,&line);
          std::__cxx11::string::operator=((string *)&line,(string *)&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::operator+(&local_70,&line,&suffix);
          std::__cxx11::string::append((string *)local_148);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&line);
          local_130 = local_130 + 0x20;
        }
        std::__cxx11::string::append((string *)local_148);
        std::__cxx11::string::~string((string *)&epilogue);
        std::__cxx11::string::~string((string *)&suffix);
        std::__cxx11::string::~string((string *)&prefix);
        goto LAB_002603ae;
      }
      goto LAB_00260094;
    }
    lines.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         lines.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  } while( true );
}

Assistant:

string BuildCommentsString(const SourceLocation& location,
                           bool prefer_single_line) {
  const string& comments = location.leading_comments.empty()
                               ? location.trailing_comments
                               : location.leading_comments;
  vector<string> lines;
  SplitStringAllowEmpty(comments, "\n", &lines);
  while (!lines.empty() && lines.back().empty()) {
    lines.pop_back();
  }
  // If there are no comments, just return an empty string.
  if (lines.size() == 0) {
    return "";
  }

  string prefix;
  string suffix;
  string final_comments;
  string epilogue;

  bool add_leading_space = false;

  if (prefer_single_line && lines.size() == 1) {
    prefix = "/** ";
    suffix = " */\n";
  } else {
    prefix = "* ";
    suffix = "\n";
    final_comments += "/**\n";
    epilogue = " **/\n";
    add_leading_space = true;
  }

  for (int i = 0; i < lines.size(); i++) {
    string line = StripPrefixString(lines[i], " ");
    // HeaderDoc and appledoc use '\' and '@' for markers; escape them.
    line = StringReplace(line, "\\", "\\\\", true);
    line = StringReplace(line, "@", "\\@", true);
    // Decouple / from * to not have inline comments inside comments.
    line = StringReplace(line, "/*", "/\\*", true);
    line = StringReplace(line, "*/", "*\\/", true);
    line = prefix + line;
    StripWhitespace(&line);
    // If not a one line, need to add the first space before *, as
    // StripWhitespace would have removed it.
    line = (add_leading_space ? " " : "") + line;
    final_comments += line + suffix;
  }
  final_comments += epilogue;
  return final_comments;
}